

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

long gzseek64(gzFile file,long offset,int whence)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  __off_t _Var4;
  ulong uVar5;
  
  if (file == (gzFile)0x0) {
    return -1;
  }
  uVar1 = file[1].have;
  if ((uVar1 != 0x79b1) && (uVar1 != 0x1c4f)) {
    return -1;
  }
  iVar3 = *(int *)((long)&file[4].pos + 4);
  if ((iVar3 != 0) && (iVar3 != -5)) {
    return -1;
  }
  if (1 < (uint)whence) {
    return -1;
  }
  if (whence == 0) {
    offset = offset - file->pos;
  }
  else if ((int)file[4].pos != 0) {
    offset = (long)(file[4].next + offset);
  }
  *(undefined4 *)&file[4].pos = 0;
  if (uVar1 == 0x1c4f) {
    if ((*(int *)((long)&file[2].pos + 4) == 1) && (-1 < (long)(offset + file->pos))) {
      _Var4 = lseek(*(int *)&file[1].field_0x4,offset - (ulong)file->have,1);
      if (_Var4 == -1) {
        return -1;
      }
      file->have = 0;
      file[3].next = (uchar *)0x0;
      *(undefined4 *)&file[4].pos = 0;
      gz_error((gz_statep)file,0,(char *)0x0);
      *(undefined4 *)&file[5].pos = 0;
      lVar2 = file->pos;
      file->pos = offset + lVar2;
      return (long)(uchar *)(offset + lVar2);
    }
    if (offset < 0) {
      offset = offset + file->pos;
      if (offset < 0) {
        return -1;
      }
      iVar3 = gzrewind(file);
      if (iVar3 == -1) {
        return -1;
      }
      if (file[1].have != 0x1c4f) goto LAB_0014c56a;
    }
    uVar1 = file->have;
    uVar5 = offset & 0xffffffff;
    if ((uchar *)(ulong)uVar1 <= (ulong)offset) {
      uVar5 = (ulong)uVar1;
    }
    file->have = uVar1 - (int)uVar5;
    file->next = file->next + uVar5;
    file->pos = file->pos + uVar5;
    offset = offset + -uVar5;
  }
  else if (offset < 0) {
    return -1;
  }
LAB_0014c56a:
  if ((uchar *)offset != (uchar *)0x0) {
    *(undefined4 *)&file[4].pos = 1;
    file[4].next = (uchar *)offset;
  }
  return (long)(uchar *)(offset + file->pos);
}

Assistant:

z_off64_t ZEXPORT gzseek64(gzFile file, z_off64_t offset, int whence) {
    unsigned n;
    z_off64_t ret;
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* check that there's no error */
    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;

    /* can only seek from start or relative to current position */
    if (whence != SEEK_SET && whence != SEEK_CUR)
        return -1;

    /* normalize offset to a SEEK_CUR specification */
    if (whence == SEEK_SET)
        offset -= state->x.pos;
    else if (state->seek)
        offset += state->skip;
    state->seek = 0;

    /* if within raw area while reading, just go there */
    if (state->mode == GZ_READ && state->how == COPY &&
            state->x.pos + offset >= 0) {
        ret = LSEEK(state->fd, offset - (z_off64_t)state->x.have, SEEK_CUR);
        if (ret == -1)
            return -1;
        state->x.have = 0;
        state->eof = 0;
        state->past = 0;
        state->seek = 0;
        gz_error(state, Z_OK, NULL);
        state->strm.avail_in = 0;
        state->x.pos += offset;
        return state->x.pos;
    }

    /* calculate skip amount, rewinding if needed for back seek when reading */
    if (offset < 0) {
        if (state->mode != GZ_READ)         /* writing -- can't go backwards */
            return -1;
        offset += state->x.pos;
        if (offset < 0)                     /* before start of file! */
            return -1;
        if (gzrewind(file) == -1)           /* rewind, then skip to offset */
            return -1;
    }

    /* if reading, skip what's in output buffer (one less gzgetc() check) */
    if (state->mode == GZ_READ) {
        n = GT_OFF(state->x.have) || (z_off64_t)state->x.have > offset ?
            (unsigned)offset : state->x.have;
        state->x.have -= n;
        state->x.next += n;
        state->x.pos += n;
        offset -= n;
    }

    /* request skip (if not zero) */
    if (offset) {
        state->seek = 1;
        state->skip = offset;
    }
    return state->x.pos + offset;
}